

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_util.c
# Opt level: O3

int aom_compare_img(aom_image_t *img1,aom_image_t *img2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  aom_img_fmt_t aVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uchar *puVar9;
  uchar *puVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  
  uVar1 = img1->d_w;
  uVar2 = img1->x_chroma_shift;
  uVar3 = img1->d_h;
  uVar4 = img1->y_chroma_shift;
  aVar5 = img1->fmt;
  iVar6 = img1->monochrome;
  uVar18 = (uint)(img2->d_h == uVar3 && (img2->d_w == uVar1 && img2->fmt == aVar5));
  uVar14 = 0;
  do {
    uVar12 = uVar4 + uVar3 >> ((byte)uVar4 & 0x1f);
    if (uVar14 == 0) {
      uVar12 = uVar3;
    }
    if (uVar12 != 0) {
      uVar11 = uVar2 + uVar1 >> ((byte)uVar2 & 0x1f);
      if (uVar14 == 0) {
        uVar11 = uVar1;
      }
      puVar9 = img1->planes[uVar14];
      iVar7 = img1->stride[uVar14];
      puVar10 = img2->planes[uVar14];
      iVar8 = img2->stride[uVar14];
      uVar15 = (ulong)uVar12;
      uVar17 = 0;
      uVar16 = 0;
      do {
        iVar13 = bcmp(puVar9 + uVar17,puVar10 + uVar16,(ulong)(uVar11 << ((byte)(aVar5 >> 0xb) & 1))
                     );
        if (iVar13 != 0) {
          uVar18 = 0;
        }
        uVar16 = (ulong)(uint)((int)uVar16 + iVar8);
        uVar17 = (ulong)(uint)((int)uVar17 + iVar7);
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
  } while ((iVar6 == 0) && (bVar19 = uVar14 < 2, uVar14 = uVar14 + 1, bVar19));
  return uVar18;
}

Assistant:

int aom_compare_img(const aom_image_t *const img1,
                    const aom_image_t *const img2) {
  assert(img1->cp == img2->cp);
  assert(img1->tc == img2->tc);
  assert(img1->mc == img2->mc);
  assert(img1->monochrome == img2->monochrome);

  int num_planes = img1->monochrome ? 1 : 3;

  uint32_t l_w = img1->d_w;
  uint32_t c_w = (img1->d_w + img1->x_chroma_shift) >> img1->x_chroma_shift;
  const uint32_t c_h =
      (img1->d_h + img1->y_chroma_shift) >> img1->y_chroma_shift;
  int match = 1;

  match &= (img1->fmt == img2->fmt);
  match &= (img1->d_w == img2->d_w);
  match &= (img1->d_h == img2->d_h);
  if (img1->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    l_w *= 2;
    c_w *= 2;
  }

  for (int plane = 0; plane < num_planes; ++plane) {
    uint32_t height = plane ? c_h : img1->d_h;
    uint32_t width = plane ? c_w : l_w;

    for (uint32_t i = 0; i < height; ++i) {
      match &=
          (memcmp(img1->planes[plane] + i * img1->stride[plane],
                  img2->planes[plane] + i * img2->stride[plane], width) == 0);
    }
  }

  return match;
}